

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall depspawn::internal::ThreadPool::resize(ThreadPool *this,int new_nthreads)

{
  int iVar1;
  domain_error *this_00;
  size_type sVar2;
  void *in_RSI;
  ThreadPool *in_RDI;
  int local_c;
  
  local_c = (int)in_RSI;
  if (local_c < 0) {
    iVar1 = std::thread::hardware_concurrency();
    local_c = iVar1 + local_c;
    if (local_c < 0) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error(this_00,"Negative number of threads");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  wait(in_RDI,in_RSI);
  while (sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&in_RDI->threads_),
        sVar2 < (ulong)(long)local_c) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(depspawn::internal::ThreadPool::*)(),depspawn::internal::ThreadPool*>
              ((vector<std::thread,_std::allocator<std::thread>_> *)main,(type *)in_RDI,
               (ThreadPool **)in_RDI);
  }
  in_RDI->nthreads_in_use_ = local_c;
  return;
}

Assistant:

void resize(int new_nthreads)
  {

    if(new_nthreads < 0 ) {
      new_nthreads += static_cast<int>(std::thread::hardware_concurrency());
      if (new_nthreads < 0) {
        throw std::domain_error("Negative number of threads");
      }
    }

    wait();

    // can only grow
    while (threads_.size() < static_cast<size_t>(new_nthreads)) {
      threads_.emplace_back(&ThreadPool::main, this);
    }
    nthreads_in_use_ = new_nthreads;
  }